

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hpp
# Opt level: O1

void process_command_line_arguments(int argc,char **argv)

{
  byte bVar1;
  int iVar2;
  size_type sVar3;
  size_type sVar4;
  char *pcVar5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  FILE *__stream;
  int *piVar9;
  char *pcVar10;
  char **__command;
  string *psVar11;
  ulong uVar12;
  char *unaff_R15;
  int flags;
  int option_index;
  option long_options [15];
  char acStack_2d0 [136];
  char **ppcStack_248;
  char **ppcStack_240;
  char *pcStack_238;
  code *pcStack_230;
  uint local_220;
  undefined1 local_21c [4];
  char *local_218;
  undefined4 local_210;
  undefined8 local_208;
  undefined4 local_200;
  char *local_1f8;
  undefined4 local_1f0;
  undefined8 local_1e8;
  undefined4 local_1e0;
  char *local_1d8;
  undefined4 local_1d0;
  undefined8 local_1c8;
  undefined4 local_1c0;
  char *local_1b8;
  undefined4 local_1b0;
  undefined8 local_1a8;
  undefined4 local_1a0;
  char *local_198;
  undefined4 local_190;
  undefined8 local_188;
  undefined4 local_180;
  char *local_178;
  undefined4 local_170;
  undefined8 local_168;
  undefined4 local_160;
  char *local_158;
  undefined4 local_150;
  undefined8 local_148;
  undefined4 local_140;
  char *local_138;
  undefined4 local_130;
  uint *local_128;
  undefined4 local_120;
  char *local_118;
  undefined4 local_110;
  uint *local_108;
  undefined4 local_100;
  char *local_f8;
  undefined4 local_f0;
  uint *local_e8;
  undefined4 local_e0;
  char *local_d8;
  undefined4 local_d0;
  uint *local_c8;
  undefined4 local_c0;
  char *local_b8;
  undefined4 local_b0;
  uint *local_a8;
  undefined4 local_a0;
  char *local_98;
  undefined4 local_90;
  uint *local_88;
  undefined4 local_80;
  char *local_78;
  undefined4 local_70;
  uint *local_68;
  undefined4 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_218 = "start";
  local_210 = 0;
  local_208 = 0;
  local_200 = 0x73;
  local_1f8 = "keymap";
  local_1f0 = 1;
  local_1e8 = 0;
  local_1e0 = 0x6d;
  local_1d8 = "output";
  local_1d0 = 1;
  local_1c8 = 0;
  local_1c0 = 0x6f;
  local_1b8 = "us-keymap";
  local_1b0 = 0;
  local_1a8 = 0;
  local_1a0 = 0x75;
  local_198 = "kill";
  local_190 = 0;
  local_188 = 0;
  local_180 = 0x6b;
  local_178 = "device";
  local_170 = 1;
  local_168 = 0;
  local_160 = 100;
  local_158 = "help";
  local_150 = 0;
  local_148 = 0;
  local_140 = 0x3f;
  local_138 = "export-keymap";
  local_130 = 1;
  local_128 = &local_220;
  local_120 = 1;
  local_118 = "no-func-keys";
  local_110 = 0;
  local_100 = 2;
  local_f8 = "no-timestamps";
  local_f0 = 0;
  local_e0 = 4;
  local_d8 = "post-http";
  local_d0 = 1;
  local_c0 = 8;
  local_b8 = "post-irc";
  local_b0 = 1;
  local_a0 = 0x10;
  local_98 = "post-size";
  local_90 = 1;
  local_80 = 0x20;
  local_78 = "no-daemon";
  local_70 = 0;
  local_60 = 0x40;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_108 = local_128;
  local_e8 = local_128;
  local_c8 = local_128;
  local_a8 = local_128;
  local_88 = local_128;
  local_68 = local_128;
  do {
LAB_00105bd4:
    pcStack_230 = (code *)0x105be9;
    __command = argv;
    psVar11 = (string *)(ulong)(uint)argc;
    iVar6 = getopt_long((string *)(ulong)(uint)argc,argv,"sm:o:ukd:?",&local_218,local_21c);
    pcVar8 = _optarg;
    sVar4 = args.device._M_string_length;
    sVar3 = args.keymap._M_string_length;
    pcVar10 = (char *)args.logfile._M_string_length;
    if (99 < iVar6) {
      switch(iVar6) {
      case 0x6b:
        args.kill = true;
        goto LAB_00105bd4;
      case 0x6c:
      case 0x6e:
      case 0x70:
      case 0x71:
      case 0x72:
      case 0x74:
switchD_00105c08_caseD_6c:
        pcStack_230 = execute_abi_cxx11_;
        process_command_line_arguments();
        pcStack_238 = "sm:o:ukd:?";
        ppcStack_248 = argv;
        ppcStack_240 = &local_218;
        pcStack_230 = (code *)unaff_R15;
        __stream = popen((char *)__command,"r");
        if (__stream == (FILE *)0x0) {
          piVar9 = __errno_location();
          error(1,*piVar9,"Pipe error");
        }
        *(string **)psVar11 = psVar11 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>(psVar11,"");
        iVar6 = feof(__stream);
        while (iVar6 == 0) {
          pcVar10 = fgets(acStack_2d0,0x80,__stream);
          if (pcVar10 != (char *)0x0) {
            std::__cxx11::string::append((char *)psVar11);
          }
          iVar6 = feof(__stream);
        }
        pclose(__stream);
        return;
      case 0x6d:
switchD_00105c08_caseD_6d:
        pcStack_230 = (code *)0x105caa;
        strlen(_optarg);
        uVar12 = 0x10cc60;
        pcVar10 = (char *)sVar3;
        break;
      case 0x6f:
        pcStack_230 = (code *)0x105d69;
        strlen(_optarg);
        uVar12 = 0x10cc40;
        break;
      case 0x73:
        args.start = true;
        goto LAB_00105bd4;
      case 0x75:
        goto switchD_00105c08_caseD_75;
      default:
        if (iVar6 != 100) goto switchD_00105c08_caseD_6c;
        pcStack_230 = (code *)0x105d3b;
        strlen(_optarg);
        uVar12 = 0x10cc80;
        pcVar10 = (char *)sVar4;
      }
LAB_00105d70:
      pcStack_230 = (code *)0x105d80;
      std::__cxx11::string::_M_replace(uVar12,0,pcVar10,(ulong)pcVar8);
      unaff_R15 = pcVar8;
      goto LAB_00105bd4;
    }
    if (iVar6 != 0) {
      iVar2 = _optind;
      if (iVar6 == -1) {
        while (iVar2 < argc) {
          _optind = iVar2 + 1;
          pcStack_230 = (code *)0x105ee4;
          error(0,0,"Non-option argument %s",argv[iVar2]);
          iVar2 = _optind;
        }
        _optind = iVar2;
        return;
      }
      if (iVar6 == 0x3f) {
        pcStack_230 = (code *)0x105f07;
        process_command_line_arguments();
      }
      goto switchD_00105c08_caseD_6c;
    }
    args.flags = args.flags | local_220;
    if ((int)local_220 < 0x10) {
      if (local_220 == 1) goto switchD_00105c08_caseD_6d;
      if (local_220 == 8) {
        pcStack_230 = (code *)0x105c53;
        iVar6 = strncmp(_optarg,"http://",7);
        if (iVar6 != 0) {
          pcStack_230 = (code *)0x105c6c;
          error(1,0,"HTTP URL must be like \"http://domain:port/script\"");
        }
        pcVar8 = _optarg;
        pcVar10 = (char *)args.http_url._M_string_length;
        pcStack_230 = (code *)0x105c85;
        strlen(_optarg);
        uVar12 = 0x10cca0;
        goto LAB_00105d70;
      }
      goto LAB_00105bd4;
    }
    if (local_220 != 0x10) {
      if (local_220 == 0x20) {
        pcStack_230 = (code *)0x105cda;
        iVar6 = atoi(_optarg);
        unaff_R15 = (char *)(long)iVar6;
        pcStack_230 = (code *)0x105cec;
        args.post_size = (off_t)unaff_R15;
        sVar7 = strlen(pcVar8);
        bVar1 = pcVar8[sVar7 - 1];
        if (bVar1 < 0x6b) {
          if (bVar1 == 0x4b) {
LAB_00105da6:
            args.post_size = (long)unaff_R15 * 1000;
            goto LAB_00105bd4;
          }
          if (bVar1 != 0x4d) goto LAB_00105bd4;
        }
        else if (bVar1 != 0x6d) {
          if (bVar1 == 0x6b) goto LAB_00105da6;
          goto LAB_00105bd4;
        }
        args.post_size = (long)unaff_R15 * 1000000;
      }
      goto LAB_00105bd4;
    }
    pcStack_230 = (code *)0x105de3;
    pcVar10 = strrchr(_optarg,0x40);
    pcStack_230 = (code *)0x105df3;
    pcVar8 = strrchr(pcVar8,0x3a);
    if (pcVar10 == (char *)0x0 || pcVar8 == (char *)0x0) {
      pcStack_230 = (code *)0x105e1b;
      error(1,0,"Invalid IRC FORMAT! Must be: nick_or_channel@server:port. See manual!");
    }
    *pcVar10 = '\0';
    *pcVar8 = '\0';
    pcVar5 = _optarg;
    sVar3 = args.irc_entity._M_string_length;
    pcStack_230 = (code *)0x105e3d;
    strlen(_optarg);
    pcStack_230 = (code *)0x105e54;
    std::__cxx11::string::_M_replace(0x10ccc0,0,(char *)sVar3,(ulong)pcVar5);
    sVar3 = args.irc_server._M_string_length;
    unaff_R15 = pcVar10 + 1;
    pcStack_230 = (code *)0x105e66;
    strlen(unaff_R15);
    pcStack_230 = (code *)0x105e7d;
    std::__cxx11::string::_M_replace(0x10cce0,0,(char *)sVar3,(ulong)unaff_R15);
    sVar3 = args.irc_port._M_string_length;
    pcStack_230 = (code *)0x105e8f;
    strlen(pcVar8 + 1);
    pcStack_230 = (code *)0x105ea6;
    std::__cxx11::string::_M_replace(0x10cd00,0,(char *)sVar3,(ulong)(pcVar8 + 1));
  } while( true );
switchD_00105c08_caseD_75:
  args.us_keymap = true;
  goto LAB_00105bd4;
}

Assistant:

void process_command_line_arguments(int argc, char **argv)
{
    int flags;

    struct option long_options[] = {
        {"start",     no_argument,       0, 's'},
        {"keymap",    required_argument, 0, 'm'},
        {"output",    required_argument, 0, 'o'},
        {"us-keymap", no_argument,       0, 'u'},
        {"kill",      no_argument,       0, 'k'},
        {"device",    required_argument, 0, 'd'},
        {"help",      no_argument,       0, '?'},
        {"export-keymap", required_argument, &flags, FLAG_EXPORT_KEYMAP},
        {"no-func-keys",  no_argument,       &flags, FLAG_NO_FUNC_KEYS},
        {"no-timestamps", no_argument,       &flags, FLAG_NO_TIMESTAMPS},
        {"post-http",     required_argument, &flags, FLAG_POST_HTTP},
        {"post-irc",      required_argument, &flags, FLAG_POST_IRC},
        {"post-size",     required_argument, &flags, FLAG_POST_SIZE},
        {"no-daemon",     no_argument,       &flags, FLAG_NO_DAEMON},
        {0}
    };

    int c;
    int option_index;

    while ((c = getopt_long(argc, argv, "sm:o:ukd:?", long_options, &option_index)) != -1)
    {
        switch (c)
        {
        case 's': args.start = true;     break;
        case 'm': args.keymap = optarg;  break;
        case 'o': args.logfile = optarg; break;
        case 'u': args.us_keymap = true; break;
        case 'k': args.kill = true;      break;
        case 'd': args.device = optarg;  break;

        case  0:
            args.flags |= flags;
            switch (flags)
            {
            case FLAG_EXPORT_KEYMAP: args.keymap = optarg; break;

            case FLAG_POST_HTTP:
                if (strncmp(optarg, "http://", 7)  != 0)
                    error(EXIT_FAILURE, 0, "HTTP URL must be like \"http://domain:port/script\"");
                args.http_url = optarg;
                break;

            case FLAG_POST_IRC: {
                // optarg string should be like "entity@server:port", now dissect it
                char *main_sep = strrchr(optarg, '@');
                char *port_sep = strrchr(optarg, ':');
                if (main_sep == NULL || port_sep == NULL)
                    error(EXIT_FAILURE, 0, "Invalid IRC FORMAT! Must be: nick_or_channel@server:port. See manual!");
                *main_sep = '\0';                                                 // replace @ with \0 to have entity string that starts at optarg
                *port_sep = '\0';                                                 // replace : with \0 to have server string that starts at main_sep+1
                args.irc_entity = optarg;
                args.irc_server = main_sep + 1;
                args.irc_port = port_sep + 1;
                break;
            }

            case FLAG_POST_SIZE:
                args.post_size = atoi(optarg);
                switch (optarg[strlen(optarg) - 1])                                                 // process any trailing M(egabytes) or K(ilobytes)
                {
                case 'K': case 'k': args.post_size *= 1000;    break;
                case 'M': case 'm': args.post_size *= 1000000; break;
                }
            }
            break;

        case '?': usage(); exit(EXIT_SUCCESS);
        default: usage(); exit(EXIT_FAILURE);
        }
    }             // while

    while(optind < argc)
        error(0, 0, "Non-option argument %s", argv[optind++]);
}